

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O3

long os_get_sys_clock_ms(void)

{
  long lVar1;
  
  if (os_get_sys_clock_ms::start == '\0') {
    os_get_sys_clock_ms_cold_1();
  }
  lVar1 = std::chrono::_V2::steady_clock::now();
  return (lVar1 - (long)os_get_sys_clock_ms::start.__d.__r) / 1000000;
}

Assistant:

long
os_get_sys_clock_ms( void )
{
    using namespace std::chrono;
    static const auto start = steady_clock::now();
    return duration_cast<milliseconds>(steady_clock::now() - start).count();
}